

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleStringsCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char cVar1;
  cmMakefile *this_01;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  BOM BVar8;
  uint uVar9;
  size_type sVar10;
  const_reference pvVar11;
  string *psVar12;
  undefined8 uVar13;
  ostream *poVar14;
  char *pcVar15;
  char *outFileName;
  streamoff sVar16;
  long lVar17;
  ulong uVar18;
  reference pcVar19;
  bool local_1455;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_1348;
  char i_2;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  string *sr;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string output;
  char *sep;
  uint local_12e0;
  uint j_2;
  uint j_1;
  uint j;
  uint num_utf8_bytes;
  int c1;
  uint i_1;
  int c;
  string current_str;
  undefined1 local_1298 [8];
  string s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  uint local_1258;
  int output_size;
  uint bytes_rem;
  int bom_found;
  undefined1 local_1230 [8];
  ostringstream e_8;
  long local_10b8;
  ifstream fin;
  string local_eb0 [8];
  string binaryFileName;
  undefined1 local_e70 [8];
  ostringstream e_7;
  string local_cf8;
  undefined1 local_cd8 [8];
  ostringstream e_6;
  string local_b60;
  undefined1 local_b40 [8];
  ostringstream e_5;
  string local_9c8;
  undefined1 local_9a8 [8];
  ostringstream e_4;
  int local_82c;
  undefined1 local_828 [4];
  int len_1;
  undefined1 local_808 [8];
  ostringstream e_3;
  int local_68c;
  undefined1 local_688 [4];
  int len;
  undefined1 local_668 [8];
  ostringstream e_2;
  int local_4ec;
  undefined1 local_4e8 [4];
  int count;
  undefined1 local_4c8 [8];
  ostringstream e_1;
  int local_34c;
  string local_348;
  undefined1 local_328 [8];
  ostringstream e;
  uint local_1b0;
  int local_1ac;
  uint i;
  int arg_mode;
  int encoding;
  bool hex_conversion_enabled;
  bool newline_consume;
  bool have_regex;
  RegularExpression regex;
  int local_c8;
  uint limit_count;
  int limit_output;
  int limit_input;
  uint maxlen;
  uint minlen;
  string outVar;
  undefined1 local_78 [8];
  string fileName;
  allocator<char> local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar10 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size(args);
  if (sVar10 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"STRINGS requires a file name and output variable",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = 0;
  }
  else {
    pvVar11 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](local_20,1);
    std::__cxx11::string::string((string *)local_78,(string *)pvVar11);
    bVar3 = cmsys::SystemTools::FileIsFullPath((string *)local_78);
    if (!bVar3) {
      psVar12 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      std::__cxx11::string::operator=((string *)local_78,(string *)psVar12);
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](local_20,1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&outVar.field_2 + 8),"/",pvVar11);
      std::__cxx11::string::operator+=
                ((string *)local_78,(string *)(outVar.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(outVar.field_2._M_local_buf + 8));
    }
    pvVar11 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](local_20,2);
    std::__cxx11::string::string((string *)&maxlen,(string *)pvVar11);
    limit_input = 0;
    limit_output = 0;
    limit_count = 0xffffffff;
    local_c8 = -1;
    regex._204_4_ = 0;
    cmsys::RegularExpression::RegularExpression((RegularExpression *)&encoding);
    bVar5 = false;
    bVar2 = false;
    bVar3 = true;
    i = 0;
    local_1ac = 0;
    for (local_1b0 = 3;
        sVar10 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(local_20), local_1b0 < sVar10; local_1b0 = local_1b0 + 1) {
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](local_20,(ulong)local_1b0);
      bVar4 = std::operator==(pvVar11,"LIMIT_INPUT");
      if (bVar4) {
        local_1ac = 1;
      }
      else {
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](local_20,(ulong)local_1b0);
        bVar4 = std::operator==(pvVar11,"LIMIT_OUTPUT");
        if (bVar4) {
          local_1ac = 2;
        }
        else {
          pvVar11 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](local_20,(ulong)local_1b0);
          bVar4 = std::operator==(pvVar11,"LIMIT_COUNT");
          if (bVar4) {
            local_1ac = 3;
          }
          else {
            pvVar11 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](local_20,(ulong)local_1b0);
            bVar4 = std::operator==(pvVar11,"LENGTH_MINIMUM");
            if (bVar4) {
              local_1ac = 4;
            }
            else {
              pvVar11 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](local_20,(ulong)local_1b0);
              bVar4 = std::operator==(pvVar11,"LENGTH_MAXIMUM");
              if (bVar4) {
                local_1ac = 5;
              }
              else {
                pvVar11 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](local_20,(ulong)local_1b0);
                bVar4 = std::operator==(pvVar11,"REGEX");
                if (bVar4) {
                  local_1ac = 7;
                }
                else {
                  pvVar11 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[](local_20,(ulong)local_1b0);
                  bVar4 = std::operator==(pvVar11,"NEWLINE_CONSUME");
                  if (bVar4) {
                    bVar2 = true;
                    local_1ac = 0;
                  }
                  else {
                    pvVar11 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[](local_20,(ulong)local_1b0);
                    bVar4 = std::operator==(pvVar11,"NO_HEX_CONVERSION");
                    if (bVar4) {
                      bVar3 = false;
                      local_1ac = 0;
                    }
                    else {
                      pvVar11 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::operator[](local_20,(ulong)local_1b0);
                      bVar4 = std::operator==(pvVar11,"ENCODING");
                      if (bVar4) {
                        local_1ac = 8;
                      }
                      else {
                        if (local_1ac == 1) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](local_20,(ulong)local_1b0);
                          uVar13 = std::__cxx11::string::c_str();
                          iVar7 = __isoc99_sscanf(uVar13,"%d",&limit_count);
                          if ((iVar7 != 1) || ((int)limit_count < 0)) {
                            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
                            poVar14 = std::operator<<((ostream *)local_328,
                                                      "STRINGS option LIMIT_INPUT value \"");
                            pvVar11 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[](local_20,(ulong)local_1b0);
                            poVar14 = std::operator<<(poVar14,(string *)pvVar11);
                            std::operator<<(poVar14,"\" is not an unsigned integer.");
                            std::__cxx11::ostringstream::str();
                            cmCommand::SetError(&this->super_cmCommand,&local_348);
                            std::__cxx11::string::~string((string *)&local_348);
                            this_local._7_1_ = 0;
                            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
                            goto LAB_001e2498;
                          }
                        }
                        else if (local_1ac == 2) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](local_20,(ulong)local_1b0);
                          uVar13 = std::__cxx11::string::c_str();
                          iVar7 = __isoc99_sscanf(uVar13,"%d",&local_c8);
                          if ((iVar7 != 1) || (local_c8 < 0)) {
                            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                            poVar14 = std::operator<<((ostream *)local_4c8,
                                                      "STRINGS option LIMIT_OUTPUT value \"");
                            pvVar11 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[](local_20,(ulong)local_1b0);
                            poVar14 = std::operator<<(poVar14,(string *)pvVar11);
                            std::operator<<(poVar14,"\" is not an unsigned integer.");
                            std::__cxx11::ostringstream::str();
                            cmCommand::SetError(&this->super_cmCommand,(string *)local_4e8);
                            std::__cxx11::string::~string((string *)local_4e8);
                            this_local._7_1_ = 0;
                            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
                            goto LAB_001e2498;
                          }
                        }
                        else if (local_1ac == 3) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](local_20,(ulong)local_1b0);
                          uVar13 = std::__cxx11::string::c_str();
                          iVar7 = __isoc99_sscanf(uVar13,"%d",&local_4ec);
                          if ((iVar7 != 1) || (local_4ec < 0)) {
                            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_668);
                            poVar14 = std::operator<<((ostream *)local_668,
                                                      "STRINGS option LIMIT_COUNT value \"");
                            pvVar11 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[](local_20,(ulong)local_1b0);
                            poVar14 = std::operator<<(poVar14,(string *)pvVar11);
                            std::operator<<(poVar14,"\" is not an unsigned integer.");
                            std::__cxx11::ostringstream::str();
                            cmCommand::SetError(&this->super_cmCommand,(string *)local_688);
                            std::__cxx11::string::~string((string *)local_688);
                            this_local._7_1_ = 0;
                            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_668);
                            goto LAB_001e2498;
                          }
                          regex._204_4_ = local_4ec;
                        }
                        else if (local_1ac == 4) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](local_20,(ulong)local_1b0);
                          uVar13 = std::__cxx11::string::c_str();
                          iVar7 = __isoc99_sscanf(uVar13,"%d",&local_68c);
                          if ((iVar7 != 1) || (local_68c < 0)) {
                            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_808);
                            poVar14 = std::operator<<((ostream *)local_808,
                                                      "STRINGS option LENGTH_MINIMUM value \"");
                            pvVar11 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[](local_20,(ulong)local_1b0);
                            poVar14 = std::operator<<(poVar14,(string *)pvVar11);
                            std::operator<<(poVar14,"\" is not an unsigned integer.");
                            std::__cxx11::ostringstream::str();
                            cmCommand::SetError(&this->super_cmCommand,(string *)local_828);
                            std::__cxx11::string::~string((string *)local_828);
                            this_local._7_1_ = 0;
                            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_808);
                            goto LAB_001e2498;
                          }
                          limit_input = local_68c;
                        }
                        else if (local_1ac == 5) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](local_20,(ulong)local_1b0);
                          uVar13 = std::__cxx11::string::c_str();
                          iVar7 = __isoc99_sscanf(uVar13,"%d",&local_82c);
                          if ((iVar7 != 1) || (local_82c < 0)) {
                            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9a8);
                            poVar14 = std::operator<<((ostream *)local_9a8,
                                                      "STRINGS option LENGTH_MAXIMUM value \"");
                            pvVar11 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[](local_20,(ulong)local_1b0);
                            poVar14 = std::operator<<(poVar14,(string *)pvVar11);
                            std::operator<<(poVar14,"\" is not an unsigned integer.");
                            std::__cxx11::ostringstream::str();
                            cmCommand::SetError(&this->super_cmCommand,&local_9c8);
                            std::__cxx11::string::~string((string *)&local_9c8);
                            this_local._7_1_ = 0;
                            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9a8);
                            goto LAB_001e2498;
                          }
                          limit_output = local_82c;
                        }
                        else if (local_1ac == 7) {
                          pvVar11 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[](local_20,(ulong)local_1b0);
                          bVar5 = cmsys::RegularExpression::compile
                                            ((RegularExpression *)&encoding,pvVar11);
                          if (!bVar5) {
                            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b40);
                            poVar14 = std::operator<<((ostream *)local_b40,
                                                      "STRINGS option REGEX value \"");
                            pvVar11 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[](local_20,(ulong)local_1b0);
                            poVar14 = std::operator<<(poVar14,(string *)pvVar11);
                            std::operator<<(poVar14,"\" could not be compiled.");
                            std::__cxx11::ostringstream::str();
                            cmCommand::SetError(&this->super_cmCommand,&local_b60);
                            std::__cxx11::string::~string((string *)&local_b60);
                            this_local._7_1_ = 0;
                            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b40);
                            goto LAB_001e2498;
                          }
                          bVar5 = true;
                        }
                        else {
                          if (local_1ac != 8) {
                            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e70);
                            poVar14 = std::operator<<((ostream *)local_e70,
                                                      "STRINGS given unknown argument \"");
                            pvVar11 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[](local_20,(ulong)local_1b0);
                            poVar14 = std::operator<<(poVar14,(string *)pvVar11);
                            std::operator<<(poVar14,"\"");
                            std::__cxx11::ostringstream::str();
                            cmCommand::SetError(&this->super_cmCommand,
                                                (string *)((long)&binaryFileName.field_2 + 8));
                            std::__cxx11::string::~string
                                      ((string *)(binaryFileName.field_2._M_local_buf + 8));
                            this_local._7_1_ = 0;
                            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e70);
                            goto LAB_001e2498;
                          }
                          pvVar11 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[](local_20,(ulong)local_1b0);
                          bVar4 = std::operator==(pvVar11,"UTF-8");
                          if (bVar4) {
                            i = 1;
                          }
                          else {
                            pvVar11 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[](local_20,(ulong)local_1b0);
                            bVar4 = std::operator==(pvVar11,"UTF-16LE");
                            if (bVar4) {
                              i = 3;
                            }
                            else {
                              pvVar11 = std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::operator[](local_20,(ulong)local_1b0);
                              bVar4 = std::operator==(pvVar11,"UTF-16BE");
                              if (bVar4) {
                                i = 2;
                              }
                              else {
                                pvVar11 = std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::operator[](local_20,(ulong)local_1b0);
                                bVar4 = std::operator==(pvVar11,"UTF-32LE");
                                if (bVar4) {
                                  i = 5;
                                }
                                else {
                                  pvVar11 = std::
                                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ::operator[](local_20,(ulong)local_1b0);
                                  bVar4 = std::operator==(pvVar11,"UTF-32BE");
                                  if (!bVar4) {
                                    std::__cxx11::ostringstream::ostringstream
                                              ((ostringstream *)local_cd8);
                                    poVar14 = std::operator<<((ostream *)local_cd8,
                                                              "STRINGS option ENCODING \"");
                                    pvVar11 = std::
                                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ::operator[](local_20,(ulong)local_1b0);
                                    poVar14 = std::operator<<(poVar14,(string *)pvVar11);
                                    std::operator<<(poVar14,"\" not recognized.");
                                    std::__cxx11::ostringstream::str();
                                    cmCommand::SetError(&this->super_cmCommand,&local_cf8);
                                    std::__cxx11::string::~string((string *)&local_cf8);
                                    this_local._7_1_ = 0;
                                    std::__cxx11::ostringstream::~ostringstream
                                              ((ostringstream *)local_cd8);
                                    goto LAB_001e2498;
                                  }
                                  i = 4;
                                }
                              }
                            }
                          }
                        }
                        local_1ac = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (bVar3) {
      psVar12 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      std::__cxx11::string::string(local_eb0,(string *)psVar12);
      std::__cxx11::string::operator+=(local_eb0,"/CMakeFiles");
      std::__cxx11::string::operator+=(local_eb0,"/FileCommandStringsBinaryFile");
      pcVar15 = (char *)std::__cxx11::string::c_str();
      outFileName = (char *)std::__cxx11::string::c_str();
      bVar3 = cmHexFileConverter::TryConvert(pcVar15,outFileName);
      if (bVar3) {
        std::__cxx11::string::operator=((string *)local_78,local_eb0);
      }
      std::__cxx11::string::~string(local_eb0);
    }
    pcVar15 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(&local_10b8,pcVar15,_S_in);
    bVar6 = std::ios::operator!((ios *)((long)&local_10b8 + *(long *)(local_10b8 + -0x18)));
    if ((bVar6 & 1) == 0) {
      BVar8 = cmsys::FStream::ReadBOM((istream *)&local_10b8);
      if ((i == 0) && (BVar8 != BOM_None)) {
        i = BVar8;
      }
      local_1258 = 0;
      if ((i == 3) || (i == 2)) {
        local_1258 = 1;
      }
      if ((i == 5) || (i == 4)) {
        local_1258 = 3;
      }
      strings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&s.field_2 + 8));
      std::__cxx11::string::string((string *)local_1298);
      do {
        if (regex._204_4_ == 0) {
LAB_001e19da:
          if (-1 < (int)limit_count) {
            current_str.field_2._8_8_ = std::istream::tellg();
            sVar16 = std::fpos::operator_cast_to_long
                               ((fpos *)(current_str.field_2._M_local_buf + 8));
            local_1455 = false;
            if ((int)limit_count <= (int)sVar16) goto LAB_001e1a77;
          }
          local_1455 = std::ios::operator_cast_to_bool
                                 ((ios *)((long)&local_10b8 + *(long *)(local_10b8 + -0x18)));
        }
        else {
          sVar10 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&s.field_2 + 8));
          local_1455 = false;
          if (sVar10 < (uint)regex._204_4_) goto LAB_001e19da;
        }
LAB_001e1a77:
        if (local_1455 == false) break;
        std::__cxx11::string::string((string *)&i_1);
        c1 = std::istream::get();
        for (num_utf8_bytes = 0; num_utf8_bytes < local_1258; num_utf8_bytes = num_utf8_bytes + 1) {
          uVar9 = std::istream::get();
          bVar6 = std::ios::operator!((ios *)((long)&local_10b8 + *(long *)(local_10b8 + -0x18)));
          if ((bVar6 & 1) != 0) {
            std::istream::putback((char)&local_10b8);
            break;
          }
          c1 = c1 << 8 | uVar9;
        }
        if (i == 3) {
          c1 = (c1 & 0xffU) << 8 | (int)(c1 & 0xff00U) >> 8;
        }
        else if (i == 5) {
          c1 = c1 << 0x18 | (c1 & 0xff00U) << 8 | (int)(c1 & 0xff0000U) >> 8 | (uint)c1 >> 0x18;
        }
        if (c1 == 0xd) {
          local_34c = 5;
        }
        else {
          if (((c1 < 0) || (0xff < c1)) ||
             (((iVar7 = isprint(c1), iVar7 == 0 && (c1 != 9)) && ((c1 != 10 || (!bVar2)))))) {
            if (i == 1) {
              j_1 = 0;
              for (j_2 = 0; j_1 == 0 && j_2 < 3; j_2 = j_2 + 1) {
                if ((c1 & (uint)HandleStringsCommand::utf8_check_table[j_2][0]) ==
                    (uint)HandleStringsCommand::utf8_check_table[j_2][1]) {
                  j_1 = j_2 + 2;
                }
              }
              for (local_12e0 = 0; local_12e0 < j_1; local_12e0 = local_12e0 + 1) {
                if (local_12e0 != 0) {
                  c1 = std::istream::get();
                  bVar6 = std::ios::operator!((ios *)((long)&local_10b8 +
                                                     *(long *)(local_10b8 + -0x18)));
                  if (((bVar6 & 1) != 0) || ((c1 & 0xc0U) != 0x80)) {
                    std::istream::putback((char)&local_10b8);
                    break;
                  }
                }
                std::__cxx11::string::operator+=((string *)&i_1,(char)c1);
              }
              uVar18 = std::__cxx11::string::length();
              if (uVar18 != j_1) {
                for (sep._4_4_ = 0; lVar17 = std::__cxx11::string::size(),
                    (ulong)sep._4_4_ < lVar17 - 1U; sep._4_4_ = sep._4_4_ + 1) {
                  std::__cxx11::string::size();
                  pcVar15 = (char *)std::__cxx11::string::operator[]((ulong)&i_1);
                  c1 = (int)*pcVar15;
                  std::istream::putback((char)&local_10b8);
                }
                std::__cxx11::string::clear();
              }
            }
          }
          else {
            std::__cxx11::string::operator+=((string *)&i_1,(char)c1);
          }
          if ((c1 != 10) || (bVar2)) {
            uVar18 = std::__cxx11::string::empty();
            if ((uVar18 & 1) == 0) {
              std::__cxx11::string::operator+=((string *)local_1298,(string *)&i_1);
            }
            else {
              uVar18 = std::__cxx11::string::length();
              if ((((uint)limit_input <= uVar18) &&
                  (uVar18 = std::__cxx11::string::empty(), (uVar18 & 1) == 0)) &&
                 ((!bVar5 ||
                  (bVar3 = cmsys::RegularExpression::find
                                     ((RegularExpression *)&encoding,(string *)local_1298), bVar3)))
                 ) {
                iVar7 = std::__cxx11::string::size();
                strings.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                     iVar7 + 1 +
                     strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                if ((-1 < local_c8) &&
                   (local_c8 <=
                    strings.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)) {
                  std::__cxx11::string::clear();
                  local_34c = 6;
                  goto LAB_001e217e;
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&s.field_2 + 8),(value_type *)local_1298);
              }
              std::__cxx11::string::clear();
            }
          }
          else {
            uVar18 = std::__cxx11::string::length();
            if (((uint)limit_input <= uVar18) &&
               ((!bVar5 ||
                (bVar3 = cmsys::RegularExpression::find
                                   ((RegularExpression *)&encoding,(string *)local_1298), bVar3))))
            {
              iVar7 = std::__cxx11::string::size();
              strings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                   iVar7 + 1 +
                   strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
              if ((-1 < local_c8) &&
                 (local_c8 <=
                  strings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)) {
                std::__cxx11::string::clear();
                local_34c = 6;
                goto LAB_001e217e;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&s.field_2 + 8),(value_type *)local_1298);
            }
            std::__cxx11::string::clear();
          }
          if ((limit_output != 0) &&
             (uVar18 = std::__cxx11::string::size(), uVar18 == (uint)limit_output)) {
            uVar18 = std::__cxx11::string::length();
            if (((uint)limit_input <= uVar18) &&
               ((!bVar5 ||
                (bVar3 = cmsys::RegularExpression::find
                                   ((RegularExpression *)&encoding,(string *)local_1298), bVar3))))
            {
              iVar7 = std::__cxx11::string::size();
              strings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                   iVar7 + 1 +
                   strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
              if ((-1 < local_c8) &&
                 (local_c8 <=
                  strings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)) {
                std::__cxx11::string::clear();
                local_34c = 6;
                goto LAB_001e217e;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&s.field_2 + 8),(value_type *)local_1298);
            }
            std::__cxx11::string::clear();
          }
          local_34c = 0;
        }
LAB_001e217e:
        std::__cxx11::string::~string((string *)&i_1);
      } while ((local_34c == 0) || (local_34c == 5));
      if ((((regex._204_4_ == 0) ||
           (sVar10 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&s.field_2 + 8)), sVar10 < (uint)regex._204_4_)) &&
          ((uVar18 = std::__cxx11::string::empty(), (uVar18 & 1) == 0 &&
           (uVar18 = std::__cxx11::string::length(), (uint)limit_input <= uVar18)))) &&
         ((!bVar5 ||
          (bVar3 = cmsys::RegularExpression::find
                             ((RegularExpression *)&encoding,(string *)local_1298), bVar3)))) {
        iVar7 = std::__cxx11::string::size();
        if ((local_c8 < 0) ||
           (iVar7 + 1 +
            strings.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < local_c8)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&s.field_2 + 8),(value_type *)local_1298);
        }
      }
      output.field_2._8_8_ = (long)"PK\x01\x02" + 4;
      std::__cxx11::string::string((string *)&__range1);
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&s.field_2 + 8);
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_00);
      sr = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_00);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&sr), bVar3) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&__end1);
        std::__cxx11::string::operator+=((string *)&__range1,(char *)output.field_2._8_8_);
        output.field_2._8_8_ = (long)":/\\;" + 3;
        __end2._M_current = (char *)std::__cxx11::string::begin();
        _Stack_1348._M_current = (char *)std::__cxx11::string::end();
        while (bVar3 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffecb8), bVar3) {
          pcVar19 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&__end2);
          cVar1 = *pcVar19;
          if (cVar1 == ';') {
            std::__cxx11::string::operator+=((string *)&__range1,'\\');
          }
          std::__cxx11::string::operator+=((string *)&__range1,cVar1);
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end2);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      this_01 = (this->super_cmCommand).Makefile;
      pcVar15 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(this_01,(string *)&maxlen,pcVar15);
      this_local._7_1_ = 1;
      std::__cxx11::string::~string((string *)&__range1);
      std::__cxx11::string::~string((string *)local_1298);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&s.field_2 + 8));
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1230);
      poVar14 = std::operator<<((ostream *)local_1230,"STRINGS file \"");
      poVar14 = std::operator<<(poVar14,(string *)local_78);
      std::operator<<(poVar14,"\" cannot be read.");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&bytes_rem);
      std::__cxx11::string::~string((string *)&bytes_rem);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1230);
    }
    std::ifstream::~ifstream(&local_10b8);
LAB_001e2498:
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)&encoding);
    std::__cxx11::string::~string((string *)&maxlen);
    std::__cxx11::string::~string((string *)local_78);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCommand::HandleStringsCommand(std::vector<std::string> const& args)
{
  if (args.size() < 3) {
    this->SetError("STRINGS requires a file name and output variable");
    return false;
  }

  // Get the file to read.
  std::string fileName = args[1];
  if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
    fileName = this->Makefile->GetCurrentSourceDirectory();
    fileName += "/" + args[1];
  }

  // Get the variable in which to store the results.
  std::string outVar = args[2];

  // Parse the options.
  enum
  {
    arg_none,
    arg_limit_input,
    arg_limit_output,
    arg_limit_count,
    arg_length_minimum,
    arg_length_maximum,
    arg__maximum,
    arg_regex,
    arg_encoding
  };
  unsigned int minlen = 0;
  unsigned int maxlen = 0;
  int limit_input = -1;
  int limit_output = -1;
  unsigned int limit_count = 0;
  cmsys::RegularExpression regex;
  bool have_regex = false;
  bool newline_consume = false;
  bool hex_conversion_enabled = true;
  enum
  {
    encoding_none = cmsys::FStream::BOM_None,
    encoding_utf8 = cmsys::FStream::BOM_UTF8,
    encoding_utf16le = cmsys::FStream::BOM_UTF16LE,
    encoding_utf16be = cmsys::FStream::BOM_UTF16BE,
    encoding_utf32le = cmsys::FStream::BOM_UTF32LE,
    encoding_utf32be = cmsys::FStream::BOM_UTF32BE
  };
  int encoding = encoding_none;
  int arg_mode = arg_none;
  for (unsigned int i = 3; i < args.size(); ++i) {
    if (args[i] == "LIMIT_INPUT") {
      arg_mode = arg_limit_input;
    } else if (args[i] == "LIMIT_OUTPUT") {
      arg_mode = arg_limit_output;
    } else if (args[i] == "LIMIT_COUNT") {
      arg_mode = arg_limit_count;
    } else if (args[i] == "LENGTH_MINIMUM") {
      arg_mode = arg_length_minimum;
    } else if (args[i] == "LENGTH_MAXIMUM") {
      arg_mode = arg_length_maximum;
    } else if (args[i] == "REGEX") {
      arg_mode = arg_regex;
    } else if (args[i] == "NEWLINE_CONSUME") {
      newline_consume = true;
      arg_mode = arg_none;
    } else if (args[i] == "NO_HEX_CONVERSION") {
      hex_conversion_enabled = false;
      arg_mode = arg_none;
    } else if (args[i] == "ENCODING") {
      arg_mode = arg_encoding;
    } else if (arg_mode == arg_limit_input) {
      if (sscanf(args[i].c_str(), "%d", &limit_input) != 1 ||
          limit_input < 0) {
        std::ostringstream e;
        e << "STRINGS option LIMIT_INPUT value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_output) {
      if (sscanf(args[i].c_str(), "%d", &limit_output) != 1 ||
          limit_output < 0) {
        std::ostringstream e;
        e << "STRINGS option LIMIT_OUTPUT value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_count) {
      int count;
      if (sscanf(args[i].c_str(), "%d", &count) != 1 || count < 0) {
        std::ostringstream e;
        e << "STRINGS option LIMIT_COUNT value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      limit_count = count;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_minimum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        std::ostringstream e;
        e << "STRINGS option LENGTH_MINIMUM value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      minlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_maximum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        std::ostringstream e;
        e << "STRINGS option LENGTH_MAXIMUM value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      maxlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_regex) {
      if (!regex.compile(args[i])) {
        std::ostringstream e;
        e << "STRINGS option REGEX value \"" << args[i]
          << "\" could not be compiled.";
        this->SetError(e.str());
        return false;
      }
      have_regex = true;
      arg_mode = arg_none;
    } else if (arg_mode == arg_encoding) {
      if (args[i] == "UTF-8") {
        encoding = encoding_utf8;
      } else if (args[i] == "UTF-16LE") {
        encoding = encoding_utf16le;
      } else if (args[i] == "UTF-16BE") {
        encoding = encoding_utf16be;
      } else if (args[i] == "UTF-32LE") {
        encoding = encoding_utf32le;
      } else if (args[i] == "UTF-32BE") {
        encoding = encoding_utf32be;
      } else {
        std::ostringstream e;
        e << "STRINGS option ENCODING \"" << args[i] << "\" not recognized.";
        this->SetError(e.str());
        return false;
      }
      arg_mode = arg_none;
    } else {
      std::ostringstream e;
      e << "STRINGS given unknown argument \"" << args[i] << "\"";
      this->SetError(e.str());
      return false;
    }
  }

  if (hex_conversion_enabled) {
    // TODO: should work without temp file, but just on a memory buffer
    std::string binaryFileName = this->Makefile->GetCurrentBinaryDirectory();
    binaryFileName += "/CMakeFiles";
    binaryFileName += "/FileCommandStringsBinaryFile";
    if (cmHexFileConverter::TryConvert(fileName.c_str(),
                                       binaryFileName.c_str())) {
      fileName = binaryFileName;
    }
  }

// Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(fileName.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(fileName.c_str());
#endif
  if (!fin) {
    std::ostringstream e;
    e << "STRINGS file \"" << fileName << "\" cannot be read.";
    this->SetError(e.str());
    return false;
  }

  // If BOM is found and encoding was not specified, use the BOM
  int bom_found = cmsys::FStream::ReadBOM(fin);
  if (encoding == encoding_none && bom_found != cmsys::FStream::BOM_None) {
    encoding = bom_found;
  }

  unsigned int bytes_rem = 0;
  if (encoding == encoding_utf16le || encoding == encoding_utf16be) {
    bytes_rem = 1;
  }
  if (encoding == encoding_utf32le || encoding == encoding_utf32be) {
    bytes_rem = 3;
  }

  // Parse strings out of the file.
  int output_size = 0;
  std::vector<std::string> strings;
  std::string s;
  while ((!limit_count || strings.size() < limit_count) &&
         (limit_input < 0 || static_cast<int>(fin.tellg()) < limit_input) &&
         fin) {
    std::string current_str;

    int c = fin.get();
    for (unsigned int i = 0; i < bytes_rem; ++i) {
      int c1 = fin.get();
      if (!fin) {
        fin.putback(static_cast<char>(c1));
        break;
      }
      c = (c << 8) | c1;
    }
    if (encoding == encoding_utf16le) {
      c = ((c & 0xFF) << 8) | ((c & 0xFF00) >> 8);
    } else if (encoding == encoding_utf32le) {
      c = (((c & 0xFF) << 24) | ((c & 0xFF00) << 8) | ((c & 0xFF0000) >> 8) |
           ((c & 0xFF000000) >> 24));
    }

    if (c == '\r') {
      // Ignore CR character to make output always have UNIX newlines.
      continue;
    }

    if (c >= 0 && c <= 0xFF &&
        (isprint(c) || c == '\t' || (c == '\n' && newline_consume))) {
      // This is an ASCII character that may be part of a string.
      // Cast added to avoid compiler warning. Cast is ok because
      // c is guaranteed to fit in char by the above if...
      current_str += static_cast<char>(c);
    } else if (encoding == encoding_utf8) {
      // Check for UTF-8 encoded string (up to 4 octets)
      static const unsigned char utf8_check_table[3][2] = {
        { 0xE0, 0xC0 },
        { 0xF0, 0xE0 },
        { 0xF8, 0xF0 },
      };

      // how many octets are there?
      unsigned int num_utf8_bytes = 0;
      for (unsigned int j = 0; num_utf8_bytes == 0 && j < 3; j++) {
        if ((c & utf8_check_table[j][0]) == utf8_check_table[j][1]) {
          num_utf8_bytes = j + 2;
        }
      }

      // get subsequent octets and check that they are valid
      for (unsigned int j = 0; j < num_utf8_bytes; j++) {
        if (j != 0) {
          c = fin.get();
          if (!fin || (c & 0xC0) != 0x80) {
            fin.putback(static_cast<char>(c));
            break;
          }
        }
        current_str += static_cast<char>(c);
      }

      // if this was an invalid utf8 sequence, discard the data, and put
      // back subsequent characters
      if ((current_str.length() != num_utf8_bytes)) {
        for (unsigned int j = 0; j < current_str.size() - 1; j++) {
          c = current_str[current_str.size() - 1 - j];
          fin.putback(static_cast<char>(c));
        }
        current_str.clear();
      }
    }

    if (c == '\n' && !newline_consume) {
      // The current line has been terminated.  Check if the current
      // string matches the requirements.  The length may now be as
      // low as zero since blank lines are allowed.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else if (current_str.empty()) {
      // A non-string character has been found.  Check if the current
      // string matches the requirements.  We require that the length
      // be at least one no matter what the user specified.
      if (s.length() >= minlen && !s.empty() &&
          (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else {
      s += current_str;
    }

    if (maxlen > 0 && s.size() == maxlen) {
      // Terminate a string if the maximum length is reached.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }
      s.clear();
    }
  }

  // If there is a non-empty current string we have hit the end of the
  // input file or the input size limit.  Check if the current string
  // matches the requirements.
  if ((!limit_count || strings.size() < limit_count) && !s.empty() &&
      s.length() >= minlen && (!have_regex || regex.find(s))) {
    output_size += static_cast<int>(s.size()) + 1;
    if (limit_output < 0 || output_size < limit_output) {
      strings.push_back(s);
    }
  }

  // Encode the result in a CMake list.
  const char* sep = "";
  std::string output;
  for (std::string const& sr : strings) {
    // Separate the strings in the output to make it a list.
    output += sep;
    sep = ";";

    // Store the string in the output, but escape semicolons to
    // make sure it is a list.
    for (char i : sr) {
      if (i == ';') {
        output += '\\';
      }
      output += i;
    }
  }

  // Save the output in a makefile variable.
  this->Makefile->AddDefinition(outVar, output.c_str());
  return true;
}